

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O0

void quicly_sendstate_reset(quicly_sendstate_t *state)

{
  int iVar1;
  uint64_t in_RDI;
  uint64_t unaff_retaddr;
  quicly_ranges_t *in_stack_00000008;
  int ret;
  
  if (*(long *)(in_RDI + 0x58) == -1) {
    *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RDI + 0x50);
  }
  iVar1 = quicly_ranges_add(in_stack_00000008,unaff_retaddr,in_RDI);
  if (iVar1 != 0) {
    __assert_fail("ret == 0 && \"guaranteed to succeed, because the numebr of ranges never increases\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                  ,0x5d,"void quicly_sendstate_reset(quicly_sendstate_t *)");
  }
  quicly_ranges_clear((quicly_ranges_t *)0x14c894);
  return;
}

Assistant:

void quicly_sendstate_reset(quicly_sendstate_t *state)
{
    int ret;

    if (state->final_size == UINT64_MAX)
        state->final_size = state->size_inflight;

    ret = quicly_ranges_add(&state->acked, 0, state->final_size + 1);
    assert(ret == 0 && "guaranteed to succeed, because the numebr of ranges never increases");
    quicly_ranges_clear(&state->pending);
}